

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris.c
# Opt level: O0

void with_player_do(gchar *name,WithPlayerCallback callback)

{
  int iVar1;
  MediaPlayer2Player *pMVar2;
  gboolean result;
  MediaPlayer2Player *player;
  GError *error;
  WithPlayerCallback callback_local;
  gchar *name_local;
  
  player = (MediaPlayer2Player *)0x0;
  error = (GError *)callback;
  callback_local = (WithPlayerCallback)name;
  pMVar2 = get_player_by_name(name,(GError **)&player);
  if (pMVar2 == (MediaPlayer2Player *)0x0) {
    g_log(0,0x10,"%s",*(undefined8 *)(player + 8));
    g_error_free(player);
  }
  else {
    iVar1 = (*(code *)error)(pMVar2,0,&player);
    g_object_unref(pMVar2);
    if (iVar1 == 0) {
      g_log(0,0x10,"%s",*(undefined8 *)(player + 8));
      g_error_free(player);
    }
  }
  return;
}

Assistant:

static void
with_player_do(const gchar* name, WithPlayerCallback callback)
{
  GError* error = NULL;
  MediaPlayer2Player* player = get_player_by_name(name, &error);
  if (!player) {
    g_warning("%s", error->message);
    g_error_free(error);
    return;
  }

  gboolean result = callback(player, NULL, &error);
  g_object_unref(player);
  if (!result) {
    g_warning("%s", error->message);
    g_error_free(error);
  }
}